

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall VmaJsonWriter::WriteNumber(VmaJsonWriter *this,uint32_t n)

{
  VmaStringBuilder *this_00;
  uint uVar1;
  byte *pStr;
  byte local_12 [2];
  ulong uVar2;
  
  uVar2 = (ulong)n;
  BeginValue(this,false);
  this_00 = this->m_SB;
  pStr = local_12 + 1;
  local_12[1] = 0;
  do {
    uVar1 = (uint)uVar2;
    pStr[-1] = (char)uVar2 + (char)(uVar2 / 10) * -10 | 0x30;
    pStr = pStr + -1;
    uVar2 = uVar2 / 10;
  } while (9 < uVar1);
  VmaStringBuilder::Add(this_00,(char *)pStr);
  return;
}

Assistant:

void VmaJsonWriter::WriteNumber(uint32_t n)
{
    VMA_ASSERT(!m_InsideString);
    BeginValue(false);
    m_SB.AddNumber(n);
}